

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_row_layout(nk_context *ctx,nk_layout_format fmt,float height,int cols,int width)

{
  nk_window *win;
  nk_panel *pnVar1;
  
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, win != (nk_window *)0x0)) &&
     (win->layout != (nk_panel *)0x0)) {
    nk_panel_layout(ctx,win,height,cols);
    pnVar1 = win->layout;
    (pnVar1->row).type = (uint)(fmt != NK_DYNAMIC) << 2;
    (pnVar1->row).ratio = (float *)0x0;
    (pnVar1->row).item_offset = 0.0;
    (pnVar1->row).filled = 0.0;
    (pnVar1->row).item_width = (float)width;
  }
  return;
}

Assistant:

NK_LIB void
nk_row_layout(struct nk_context *ctx, enum nk_layout_format fmt,
float height, int cols, int width)
{
/* update the current row and set the current row layout */
struct nk_window *win;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
nk_panel_layout(ctx, win, height, cols);
if (fmt == NK_DYNAMIC)
win->layout->row.type = NK_LAYOUT_DYNAMIC_FIXED;
else win->layout->row.type = NK_LAYOUT_STATIC_FIXED;

win->layout->row.ratio = 0;
win->layout->row.filled = 0;
win->layout->row.item_offset = 0;
win->layout->row.item_width = (float)width;
}